

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_line_from_file(FILE *fp,char **p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  if (p == (char **)0x0 || fp == (FILE *)0x0) {
    return 0x16a;
  }
  pcVar3 = (char *)malloc(1);
  *p = pcVar3;
  if (pcVar3 == (char *)0x0) {
    return 0x168;
  }
  uVar5 = 1;
  iVar6 = 0;
  while( true ) {
    do {
      iVar1 = getc((FILE *)fp);
    } while (iVar1 == 0xd);
    if (iVar1 == 10) {
      iVar1 = 0;
      goto LAB_00172b29;
    }
    if (iVar1 == -1) break;
    uVar4 = ((iVar6 + 0x3e9) / 1000) * 1000;
    pcVar3 = *p;
    if ((int)uVar5 < (int)uVar4) {
      pcVar3 = (char *)realloc(pcVar3,(ulong)uVar4);
      if (pcVar3 == (char *)0x0) {
        iVar1 = 0x168;
        iVar6 = iVar6 + 1;
        goto LAB_00172b29;
      }
      *p = pcVar3;
      uVar5 = uVar4;
    }
    pcVar3[iVar6] = (char)iVar1;
    iVar6 = iVar6 + 1;
  }
  iVar2 = ferror((FILE *)fp);
  iVar1 = 0x169;
  if (iVar2 == 0) {
    iVar1 = 0;
  }
  if (iVar6 == 0) {
    return 0x16f;
  }
LAB_00172b29:
  pcVar3 = *p;
  if (iVar6 + 1U != uVar5) {
    pcVar3 = (char *)realloc(pcVar3,(long)(int)(iVar6 + 1U));
    if (pcVar3 == (char *)0x0) {
      iVar1 = 0x168;
      goto LAB_00172b5c;
    }
    *p = pcVar3;
  }
  pcVar3[iVar6] = '\0';
  if (iVar1 == 0) {
    return 0;
  }
LAB_00172b5c:
  free(*p);
  *p = (char *)0x0;
  return iVar1;
}

Assistant:

int	ngp_line_from_file(FILE *fp, char **p)
 { int	c, r, llen, allocsize, alen;
   char	*p2;

   if (NULL == fp) return(NGP_NUL_PTR);		/* check for stupid args */
   if (NULL == p) return(NGP_NUL_PTR);		/* more foolproof checks */
   
   r = NGP_OK;					/* initialize stuff, reset err code */
   llen = 0;					/* 0 characters read so far */
   *p = (char *)ngp_alloc(1);			/* preallocate 1 byte */
   allocsize = 1;				/* signal that we have allocated 1 byte */
   if (NULL == *p) return(NGP_NO_MEMORY);	/* if this failed, system is in dire straits */

   for (;;)
    { c = getc(fp);				/* get next character */
      if ('\r' == c) continue;			/* carriage return character ?  Just ignore it */
      if (EOF == c)				/* EOF signalled ? */
        { 
          if (ferror(fp)) r = NGP_READ_ERR;	/* was it real error or simply EOF ? */
	  if (0 == llen) return(NGP_EOF);	/* signal EOF only if 0 characters read so far */
          break;
        }
      if ('\n' == c) break;			/* end of line character ? */
      
      llen++;					/* we have new character, make room for it */
      alen = ((llen + NGP_ALLOCCHUNK) / NGP_ALLOCCHUNK) * NGP_ALLOCCHUNK;
      if (alen > allocsize)
        { p2 = (char *)ngp_realloc(*p, alen);	/* realloc buffer, if there is need */
          if (NULL == p2)
            { r = NGP_NO_MEMORY;
              break;
            }
	  *p = p2;
          allocsize = alen;
        }
      (*p)[llen - 1] = c;			/* copy character to buffer */
    }

   llen++;					/* place for terminating \0 */
   if (llen != allocsize)
     { p2 = (char *)ngp_realloc(*p, llen);
       if (NULL == p2) r = NGP_NO_MEMORY;
       else
         { *p = p2;
           (*p)[llen - 1] = 0;			/* copy \0 to buffer */
         }         
     }
   else
     { (*p)[llen - 1] = 0;			/* necessary when line read was empty */
     }

   if ((NGP_EOF != r) && (NGP_OK != r))		/* in case of errors free resources */
     { ngp_free(*p);
       *p = NULL;
     }
   
   return(r);					/* return  status code */
 }